

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec4 *bg_col,ImVec4 *tint_col)

{
  bool bVar1;
  byte bVar2;
  ImVec2 *in_RCX;
  ImVec4 *in_RSI;
  ImVec2 *min;
  ImVec2 *in_R8;
  long in_R9;
  float v;
  ImVec2 IVar3;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 padding;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  ImRect *in_stack_ffffffffffffff10;
  ImDrawFlags flags;
  undefined8 in_stack_ffffffffffffff18;
  ImDrawList *uv_max;
  ImVec4 *in_stack_ffffffffffffff20;
  ImRect *in_stack_ffffffffffffff28;
  ImDrawList *in_stack_ffffffffffffff30;
  ImRect *in_stack_ffffffffffffff38;
  ImDrawList *in_stack_ffffffffffffff40;
  ImU32 col_00;
  undefined8 in_stack_ffffffffffffff68;
  float rounding;
  undefined8 in_stack_ffffffffffffff70;
  bool *in_stack_ffffffffffffff78;
  bool *in_stack_ffffffffffffff80;
  ImGuiID in_stack_ffffffffffffff8c;
  ImVec2 local_60;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  ImVec2 in_stack_ffffffffffffffb0;
  ImRect local_48;
  ImGuiContext *local_38;
  long local_30;
  ImVec2 *local_28;
  ImVec2 *local_20;
  ImVec4 *local_10;
  bool local_1;
  
  rounding = (float)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_38 = GImGui;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_48.Max = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)local_48.Max + 0x9b) & 1U) == 0) {
    local_48.Min = (local_38->Style).FramePadding;
    min = (ImVec2 *)((long)local_48.Max + 0xe0);
    ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                (ImVec2 *)0x4e7fa3);
    IVar3 = ::operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0.0)
    ;
    local_60 = ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (ImVec2 *)0x4e7fdf);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffa8,min,&local_60);
    col_00 = (ImU32)min;
    ItemSize(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    flags = (ImDrawFlags)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    bVar1 = ItemAdd(in_stack_ffffffffffffff38,(ImGuiID)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                    in_stack_ffffffffffffff28,
                    (ImGuiItemFlags)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    if (bVar1) {
      bVar2 = ButtonBehavior((ImRect *)IVar3,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff78,
                             (ImGuiButtonFlags)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                  SUB84(in_stack_ffffffffffffff20,0));
      RenderNavHighlight((ImRect *)in_stack_ffffffffffffffb0,(ImGuiID)in_stack_ffffffffffffffac,
                         (ImGuiNavHighlightFlags)in_stack_ffffffffffffffa8);
      IVar3.y = in_stack_ffffffffffffffac;
      IVar3.x = in_stack_ffffffffffffffa8;
      v = ImMin<float>(local_48.Min.x,local_48.Min.y);
      ImClamp<float>(v,0.0,(local_38->Style).FrameRounding);
      RenderFrame(IVar3,in_stack_ffffffffffffffb0,(ImU32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                  SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0),rounding);
      if (0.0 < *(float *)(local_30 + 0xc)) {
        in_stack_ffffffffffffff40 = *(ImDrawList **)((long)local_48.Max + 0x278);
        in_stack_ffffffffffffff38 = &local_48;
        ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    (ImVec2 *)0x4e8191);
        ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    (ImVec2 *)0x4e81a9);
        GetColorU32(in_stack_ffffffffffffff20);
        ImDrawList::AddRectFilled
                  (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->Min,
                   (ImVec2 *)in_stack_ffffffffffffff20,
                   (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                   (float)in_stack_ffffffffffffff18,flags);
      }
      uv_max = *(ImDrawList **)((long)local_48.Max + 0x278);
      ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                  (ImVec2 *)0x4e8213);
      ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                  (ImVec2 *)0x4e822b);
      GetColorU32(local_10);
      ImDrawList::AddImage
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,local_28,local_20,
                 (ImVec2 *)local_10,(ImVec2 *)uv_max,col_00);
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImVec2 padding = g.Style.FramePadding;
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2.0f);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}